

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::ConvolutionParameter::SharedDtor(ConvolutionParameter *this)

{
  if (this != (ConvolutionParameter *)&_ConvolutionParameter_default_instance_) {
    if (this->weight_filler_ != (FillerParameter *)0x0) {
      (*(this->weight_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->bias_filler_ != (FillerParameter *)0x0) {
      (*(this->bias_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void ConvolutionParameter::SharedDtor() {
  if (this != internal_default_instance()) {
    delete weight_filler_;
  }
  if (this != internal_default_instance()) {
    delete bias_filler_;
  }
}